

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

void __thiscall restincurl::Worker::Close(Worker *this)

{
  mutex *__mutex;
  WorkerThread *pWVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  ulong uVar5;
  WorkerThread *pWStack_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  anon_class_8_1_8991fb9c aStack_30;
  Worker *pWStack_28;
  mutex *pmStack_20;
  
  __mutex = &this->mutex_;
  pmStack_20 = (mutex *)0x1084db;
  uVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (uVar2 == 0) {
    this->abort_ = true;
    pmStack_20 = (mutex *)0x1084eb;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    Signaler::Signal(&this->signal_);
    return;
  }
  uVar5 = (ulong)uVar2;
  pmStack_20 = (mutex *)Join;
  std::__throw_system_error(uVar2);
  pWStack_40 = (WorkerThread *)0x0;
  _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pWStack_28 = this;
  pmStack_20 = __mutex;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)(uVar5 + 0x10));
  if (iVar3 == 0) {
    pWVar1 = *(WorkerThread **)(uVar5 + 0x38);
    if ((pWVar1 != (WorkerThread *)0x0) && ((pWVar1->thread_)._M_id._M_thread != 0)) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&_Stack_38,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(uVar5 + 0x40));
      pWStack_40 = pWVar1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)(uVar5 + 0x10));
    if (pWStack_40 != (WorkerThread *)0x0) {
      aStack_30.this = pWStack_40;
      std::call_once<restincurl::Worker::WorkerThread::Join()const::_lambda()_1_>
                (&pWStack_40->joined_,&aStack_30);
    }
    if (_Stack_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_38._M_pi);
    }
    return;
  }
  uVar4 = std::__throw_system_error(iVar3);
  if (_Stack_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_38._M_pi);
  }
  _Unwind_Resume(uVar4);
}

Assistant:

void Close() {
            {
                lock_t lock(mutex_);
                abort_ = true;
            }
            Signal();
        }